

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O2

FT_Error pcf_load_font(FT_Stream stream,PCF_Face face,FT_Long face_index)

{
  FT_Byte FVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  FT_Memory pFVar7;
  FT_ULong FVar8;
  void *__src;
  ushort uVar9;
  bool bVar10;
  FT_Short FVar11;
  FT_Short FVar12;
  FT_Short FVar13;
  FT_Short FVar14;
  FT_Short FVar15;
  undefined4 uVar16;
  ushort uVar17;
  FT_UInt16 FVar18;
  FT_UShort FVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  FT_Error FVar23;
  FT_UInt32 FVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  size_t mm;
  PCF_Table pPVar28;
  FT_Pointer P;
  PCF_Metric pPVar29;
  FT_Byte *buffer;
  FT_Pointer pvVar30;
  ulong uVar31;
  FT_UShort *pFVar32;
  PCF_Property pPVar33;
  size_t sVar34;
  FT_String *pFVar35;
  size_t sVar36;
  FT_Bitmap_Size *pFVar37;
  ulong uVar38;
  PCF_Property pPVar39;
  char *pcVar40;
  int iVar41;
  FT_ULong *pFVar42;
  FT_ULong FVar43;
  PCF_Table pPVar44;
  FT_Frame_Field *pFVar45;
  ulong uVar46;
  PCF_Table pPVar47;
  FT_ULong FVar48;
  PCF_Metric pPVar49;
  long lVar50;
  FT_Long FVar51;
  FT_UShort FVar52;
  FT_Pointer count;
  FT_Bitmap_Size *bsize;
  FT_Error error;
  FT_Error local_ac;
  FT_Memory local_a8;
  undefined8 local_a0;
  PCF_EncRec *local_98;
  ulong local_90;
  ulong local_88;
  FT_Memory local_80;
  FT_ULong format;
  char *pcStack_70;
  char *local_68;
  char *pcStack_60;
  FT_ULong size;
  
  pFVar7 = (face->root).memory;
  FVar23 = FT_Stream_Seek(stream,0);
  if (FVar23 != 0) {
    return 3;
  }
  FVar23 = FT_Stream_ReadFields(stream,pcf_toc_header,&face->toc);
  size = CONCAT44(size._4_4_,FVar23);
  if (FVar23 != 0) {
    return 3;
  }
  if ((face->toc).version != 0x70636601) {
    return 3;
  }
  uVar31 = (face->toc).count;
  if (uVar31 == 0) {
    return 3;
  }
  uVar38 = stream->size;
  if (uVar38 < 0x10) {
    return 3;
  }
  if (9 < uVar31 || uVar38 >> 4 < uVar31) {
    uVar31 = uVar38 >> 4;
    if (0x8f < uVar38) {
      uVar31 = 9;
    }
    (face->toc).count = uVar31;
  }
  uVar38 = 0;
  local_80 = pFVar7;
  pPVar28 = (PCF_Table)ft_mem_qrealloc(pFVar7,0x20,0,uVar31,(void *)0x0,(FT_Error *)&size);
  (face->toc).tables = pPVar28;
  if ((int)size != 0) {
    return 3;
  }
  while( true ) {
    uVar31 = (face->toc).count;
    if (uVar31 <= uVar38) break;
    FVar23 = FT_Stream_ReadFields(stream,pcf_table_header,pPVar28);
    size = CONCAT44(size._4_4_,FVar23);
    if (FVar23 != 0) goto LAB_001ecda4;
    pPVar28 = pPVar28 + 1;
    uVar38 = (ulong)((int)uVar38 + 1);
  }
  pPVar28 = (face->toc).tables;
  uVar25 = 0;
  do {
    uVar38 = uVar31 - 1;
    if (uVar38 <= uVar25) goto LAB_001ecd61;
    bVar10 = false;
    uVar38 = 1;
    while( true ) {
      uVar46 = (ulong)((int)uVar38 - 1);
      if (uVar31 + ~(ulong)uVar25 <= uVar46) break;
      pPVar44 = pPVar28 + uVar46;
      uVar31 = pPVar28[uVar38].offset;
      if (uVar31 < pPVar28[uVar46].offset) {
        pPVar47 = pPVar28 + uVar38;
        format = pPVar44->type;
        pcStack_70 = (char *)pPVar44->format;
        local_68 = (char *)pPVar44->size;
        pcStack_60 = (char *)pPVar44->offset;
        FVar8 = pPVar47->type;
        FVar48 = pPVar47->format;
        FVar43 = pPVar47->offset;
        pPVar44->size = pPVar47->size;
        pPVar44->offset = FVar43;
        pPVar44->type = FVar8;
        pPVar44->format = FVar48;
        pPVar47->size = (FT_ULong)local_68;
        pPVar47->offset = (FT_ULong)pcStack_60;
        pPVar47->type = format;
        pPVar47->format = (FT_ULong)pcStack_70;
        uVar31 = pPVar47->offset;
        bVar10 = true;
      }
      if ((uVar31 < pPVar44->size) || (uVar31 - pPVar44->size < pPVar44->offset)) {
        size = CONCAT44(size._4_4_,9);
        goto LAB_001ecda4;
      }
      uVar31 = (face->toc).count;
      uVar38 = (ulong)((int)uVar38 + 1);
    }
    uVar25 = uVar25 + 1;
  } while (bVar10);
  uVar38 = uVar31 - 1;
LAB_001ecd61:
  pPVar28 = (face->toc).tables;
  uVar31 = stream->size;
  pFVar42 = &pPVar28->size;
  for (uVar25 = 0; uVar25 < uVar38; uVar25 = uVar25 + 1) {
    if ((uVar31 < *pFVar42) || (uVar31 - *pFVar42 < pFVar42[1])) goto LAB_001ecfa8;
    pFVar42 = pFVar42 + 4;
  }
  uVar38 = uVar31 - pFVar42[1];
  if (uVar31 < pFVar42[1]) {
LAB_001ecfa8:
    size = CONCAT44(size._4_4_,8);
LAB_001ecda4:
    ft_mem_free(local_80,(face->toc).tables);
    (face->toc).tables = (PCF_Table)0x0;
    local_ac = (int)size;
    if ((int)size != 0) {
      return 3;
    }
    pPVar28 = (PCF_Table)0x0;
  }
  else {
    if (uVar38 < *pFVar42) {
      *pFVar42 = uVar38;
    }
    local_ac = 0;
  }
  (face->root).num_faces = 1;
  (face->root).face_index = 0;
  if (face_index < 0) {
    return 0;
  }
  pFVar7 = (face->root).memory;
  error = pcf_seek_to_table_type(stream,pPVar28,(face->toc).count,1,&format,&size);
  if ((error == 0) && (FVar24 = FT_Stream_ReadULongLE(stream,&error), FVar24 < 0x100 && error == 0))
  {
    if ((FVar24 & 4) == 0) {
      uVar25 = FT_Stream_ReadULongLE(stream,&error);
    }
    else {
      uVar25 = FT_Stream_ReadULong(stream,&error);
    }
    if (error == 0) {
      local_a8 = (FT_Memory)CONCAT44(local_a8._4_4_,FVar24);
      local_a0 = (PCF_Property)size;
      if ((ulong)uVar25 <= size / 9) {
        uVar26 = 0x100;
        if (uVar25 < 0x100) {
          uVar26 = uVar25;
        }
        local_90 = (ulong)uVar26;
        face->nprops = uVar26;
        buffer = (FT_Byte *)0x0;
        local_88 = (ulong)uVar25;
        P = ft_mem_qrealloc(pFVar7,0x18,0,local_90,(void *)0x0,&error);
        if (error != 0) goto LAB_001ece9d;
        local_98 = (PCF_EncRec *)(local_90 * 0x18);
        buffer = (FT_Byte *)0x0;
        for (uVar31 = 0; local_98 != (PCF_EncRec *)uVar31; uVar31 = uVar31 + 0x18) {
          if (((ulong)local_a8 & 4) == 0) {
            pFVar45 = pcf_property_header;
          }
          else {
            pFVar45 = pcf_property_msb_header;
          }
          error = FT_Stream_ReadFields(stream,pFVar45,(void *)(uVar31 + (long)P));
          if (error != 0) goto LAB_001ece9d;
          error = 0;
        }
        error = FT_Stream_Skip(stream,(local_88 - local_90) * 9);
        if (error == 0) {
          FVar23 = 0;
          if (((local_88 & 3) != 0) &&
             (FVar23 = FT_Stream_Skip(stream,4 - (local_88 & 3)), FVar23 != 0)) goto LAB_001ed08c;
          error = FVar23;
          if (((ulong)local_a8 & 4) == 0) {
            uVar25 = FT_Stream_ReadULongLE(stream,&error);
          }
          else {
            uVar25 = FT_Stream_ReadULong(stream,&error);
          }
          if (error == 0) {
            pvVar30 = (FT_Pointer)(ulong)uVar25;
            if (pvVar30 <= (FT_Pointer)((long)local_a0 + local_88 * -9)) {
              count = (FT_Pointer)0x1000100;
              if (pvVar30 < (FT_Pointer)0x1000100) {
                count = pvVar30;
              }
              buffer = (FT_Byte *)ft_mem_qalloc(pFVar7,(long)count + 1,&error);
              if ((error == 0) &&
                 (error = FT_Stream_Read(stream,buffer,(FT_ULong)count), error == 0)) {
                buffer[(long)count] = '\0';
                local_a0 = (PCF_Property)ft_mem_realloc(pFVar7,0x18,0,local_90,(void *)0x0,&error);
                if (error == 0) {
                  face->properties = local_a0;
                  for (local_a8 = (FT_Memory)0x0; (FT_Memory)local_98 != local_a8;
                      local_a8 = (FT_Memory)((long)local_a8 + 0x18)) {
                    if (count < *(FT_Pointer *)((long)P + (long)local_a8)) {
LAB_001ed559:
                      error = 9;
                      goto LAB_001ece9d;
                    }
                    pvVar30 = ft_mem_strdup(pFVar7,(char *)((long)*(FT_Pointer *)
                                                                   ((long)P + (long)local_a8) +
                                                           (long)buffer),&error);
                    *(FT_Pointer *)((long)&local_a0->name + (long)local_a8) = pvVar30;
                    if (error != 0) goto LAB_001ece9d;
                    FVar1 = *(FT_Byte *)((long)P + (long)local_a8 + 8U);
                    (&local_a0->isString)[(long)local_a8] = FVar1;
                    pvVar30 = *(FT_Pointer *)((long)P + (long)local_a8 + 0x10U);
                    if (FVar1 == '\0') {
                      *(FT_Pointer *)((long)&local_a0->value + (long)local_a8) = pvVar30;
                    }
                    else {
                      if (count < pvVar30) goto LAB_001ed559;
                      pvVar30 = ft_mem_strdup(pFVar7,(char *)((long)pvVar30 + (long)buffer),&error);
                      *(FT_Pointer *)((long)&local_a0->value + (long)local_a8) = pvVar30;
                      if (error != 0) goto LAB_001ece9d;
                    }
                  }
                  error = 0;
                }
              }
              goto LAB_001ece9d;
            }
            error = 8;
          }
        }
        else {
LAB_001ed08c:
          error = 0x53;
        }
        buffer = (FT_Byte *)0x0;
        goto LAB_001ece9d;
      }
      error = 8;
    }
  }
  buffer = (FT_Byte *)0x0;
  P = (void *)0x0;
LAB_001ece9d:
  uVar31 = 1;
  ft_mem_free(pFVar7,P);
  ft_mem_free(pFVar7,buffer);
  local_ac = error;
  if (error == 0) {
    FVar8 = (face->toc).count;
    pPVar44 = (face->toc).tables;
    FVar48 = 0xffffffffffffffff;
    pPVar28 = pPVar44;
    do {
      FVar48 = FVar48 + 1;
      if (FVar8 == FVar48) {
        FVar23 = pcf_get_accel(stream,face,2);
        if (FVar23 != 0) {
          return 3;
        }
        pPVar44 = (face->toc).tables;
        local_ac = 0;
        FVar43 = (face->toc).count;
        break;
      }
      pFVar42 = &pPVar28->type;
      pPVar28 = pPVar28 + 1;
      FVar43 = FVar8;
    } while (*pFVar42 != 0x100);
    local_a8 = (face->root).memory;
    error = pcf_seek_to_table_type(stream,pPVar44,FVar43,4,&format,&size);
    if (error == 0) {
      FVar24 = FT_Stream_ReadULongLE(stream,&error);
      format = (FT_ULong)FVar24;
      if ((error == 0) && ((FVar24 & 0xfffffe00) == 0)) {
        if ((FVar24 & 0xffffff00) == 0) {
          if ((FVar24 & 4) == 0) {
            uVar25 = FT_Stream_ReadULongLE(stream,&error);
          }
          else {
            uVar25 = FT_Stream_ReadULong(stream,&error);
          }
          uVar38 = (ulong)uVar25;
        }
        else {
          if ((FVar24 & 4) == 0) {
            uVar17 = FT_Stream_ReadUShortLE(stream,&error);
          }
          else {
            uVar17 = FT_Stream_ReadUShort(stream,&error);
          }
          uVar38 = (ulong)uVar17;
        }
        if (error == 0) {
          local_98 = (PCF_EncRec *)0x5;
          if ((FVar24 & 0xffffff00) == 0) {
            uVar46 = 0xc;
          }
          else {
            uVar46 = 5;
          }
          if (uVar38 - 1 < size / uVar46) {
            FVar43 = uVar38 + 1;
            if (0xfffe < uVar38) {
              FVar43 = 0xffff;
            }
            face->nmetrics = FVar43;
            pPVar29 = (PCF_Metric)ft_mem_qrealloc(local_a8,0x18,0,FVar43,(void *)0x0,&error);
            face->metrics = pPVar29;
            if (error == 0) {
              for (; pPVar49 = pPVar29 + 1, uVar31 < face->nmetrics; uVar31 = uVar31 + 1) {
                error = pcf_get_metric(stream,format,pPVar49);
                pPVar29[1].bits = 0;
                if (error != 0) {
                  ft_mem_free(local_a8,face->metrics);
                  face->metrics = (PCF_Metric)0x0;
                  local_ac = error;
                  if (error != 0) {
                    return 3;
                  }
                  goto LAB_001ed1f2;
                }
                if ((pPVar29[1].rightSideBearing < pPVar49->leftSideBearing) ||
                   (SBORROW4((int)pPVar29[1].ascent,-(int)pPVar29[1].descent) !=
                    (int)pPVar29[1].ascent + (int)pPVar29[1].descent < 0)) {
                  pPVar29[1].descent = 0;
                  pPVar49->leftSideBearing = 0;
                  pPVar49->rightSideBearing = 0;
                  pPVar49->characterWidth = 0;
                  pPVar49->ascent = 0;
                }
                pPVar29 = pPVar49;
              }
              local_ac = 0;
LAB_001ed1f2:
              FVar23 = pcf_seek_to_table_type
                                 (stream,(face->toc).tables,(face->toc).count,8,&format,&size);
              if ((FVar23 == 0) && (error = FT_Stream_EnterFrame(stream,8), error == 0)) {
                FVar24 = FT_Stream_GetULongLE(stream);
                local_a8 = (FT_Memory)(ulong)FVar24;
                if ((FVar24 & 4) == 0) {
                  uVar25 = FT_Stream_GetULongLE(stream);
                }
                else {
                  uVar25 = FT_Stream_GetULong(stream);
                }
                FT_Stream_ExitFrame(stream);
                if ((uint)local_a8 < 0x100) {
                  uVar26 = 0xfffe;
                  if (uVar25 < 0xfffe) {
                    uVar26 = uVar25;
                  }
                  uVar31 = (ulong)uVar26;
                  if (face->nmetrics - 1 == uVar31) {
                    local_a0 = (PCF_Property)(stream->pos + uVar31 * 4 + 0x10);
                    local_90 = size;
                    for (lVar50 = 0; uVar31 * 0x18 - lVar50 != 0; lVar50 = lVar50 + 0x18) {
                      if (((ulong)local_a8 & 4) == 0) {
                        uVar25 = FT_Stream_ReadULongLE(stream,&error);
                      }
                      else {
                        uVar25 = FT_Stream_ReadULong(stream,&error);
                      }
                      uVar38 = 0;
                      if (uVar25 <= local_90) {
                        uVar38 = (ulong)uVar25;
                      }
                      *(ulong *)((long)&face->metrics[1].bits + lVar50) = uVar38 + (long)local_a0;
                    }
                    if (error == 0) {
                      do {
                        local_98 = (PCF_EncRec *)((long)local_98 + -1);
                        if (local_98 == (PCF_EncRec *)0x0) {
                          face->bitmapsFormat = (FT_ULong)local_a8;
                          local_ac = 0;
                          pFVar7 = (face->root).memory;
                          error = pcf_seek_to_table_type
                                            (stream,(face->toc).tables,(face->toc).count,0x20,
                                             &format,&size);
                          if (error != 0) {
                            return 3;
                          }
                          FVar24 = FT_Stream_ReadULongLE(stream,&error);
                          local_a8 = (FT_Memory)CONCAT44(local_a8._4_4_,FVar24);
                          if (0xff < FVar24 || error != 0) {
                            return 3;
                          }
                          local_98 = &face->enc;
                          if ((FVar24 & 4) == 0) {
                            pFVar45 = pcf_enc_header;
                          }
                          else {
                            pFVar45 = pcf_enc_msb_header;
                          }
                          error = FT_Stream_ReadFields(stream,pFVar45,local_98);
                          if (error != 0) {
                            return 3;
                          }
                          uVar17 = (face->enc).firstCol;
                          uVar3 = (face->enc).lastCol;
                          if (0xff < uVar3 || uVar3 < uVar17) {
                            return 3;
                          }
                          uVar4 = (face->enc).firstRow;
                          uVar5 = (face->enc).lastRow;
                          if (0xff < uVar5 || uVar5 < uVar4) {
                            return 3;
                          }
                          uVar6 = (face->enc).defaultChar;
                          local_a0 = (PCF_Property)
                                     (CONCAT44(local_a0._4_4_,(uint)uVar6) & 0xffffffff000000ff);
                          if ((uVar3 < (uVar6 & 0xff)) || ((ushort)local_a0 < uVar17)) {
LAB_001ed613:
                            (face->enc).defaultChar = uVar4 * 0x100 + uVar17;
                            local_a0 = (PCF_Property)CONCAT44(local_a0._4_4_,(uint)uVar17);
                            uVar9 = uVar4;
                          }
                          else if ((uVar6 >> 8 < uVar4) || (uVar9 = uVar6 >> 8, uVar5 < uVar6 >> 8))
                          goto LAB_001ed613;
                          local_90 = (((ulong)uVar5 - (ulong)uVar4) + 1) *
                                     (((ulong)uVar3 - (ulong)uVar17) + 1);
                          error = FT_Stream_EnterFrame(stream,local_90 * 2);
                          if (error != 0) {
                            return 3;
                          }
                          uVar25 = (uint)(face->enc).firstCol;
                          lVar50 = (long)(int)(((ushort)local_a0 - uVar25) +
                                              (((face->enc).lastCol - uVar25) + 1) *
                                              ((uint)uVar9 - (uint)(face->enc).firstRow));
                          if (((ulong)local_a8 & 4) == 0) {
                            uVar17 = *(ushort *)(stream->cursor + lVar50 * 2);
                          }
                          else {
                            uVar17 = *(ushort *)(stream->cursor + lVar50 * 2);
                            uVar17 = uVar17 << 8 | uVar17 >> 8;
                          }
                          if (uVar17 == 0xffff) {
                            uVar31 = 1;
                          }
                          else {
                            uVar31 = 1;
                            if ((ulong)(ushort)(uVar17 + 1) < face->nmetrics) {
                              uVar31 = (ulong)(ushort)(uVar17 + 1);
                            }
                          }
                          pPVar49 = face->metrics;
                          pPVar49->bits = pPVar49[uVar31].bits;
                          pPVar29 = pPVar49 + uVar31;
                          FVar11 = pPVar29->rightSideBearing;
                          FVar12 = pPVar29->characterWidth;
                          FVar13 = pPVar29->ascent;
                          FVar14 = pPVar29->descent;
                          FVar15 = pPVar29->attributes;
                          uVar16 = *(undefined4 *)&pPVar29->field_0xc;
                          pPVar49->leftSideBearing = pPVar29->leftSideBearing;
                          pPVar49->rightSideBearing = FVar11;
                          pPVar49->characterWidth = FVar12;
                          pPVar49->ascent = FVar13;
                          pPVar49->descent = FVar14;
                          pPVar49->attributes = FVar15;
                          *(undefined4 *)&pPVar49->field_0xc = uVar16;
                          local_88 = 2;
                          pFVar32 = (FT_UShort *)
                                    ft_mem_qrealloc(pFVar7,2,0,local_90,(void *)0x0,&error);
                          (face->enc).offset = pFVar32;
                          if (error != 0) {
                            return 3;
                          }
                          local_a0 = (PCF_Property)
                                     CONCAT44(local_a0._4_4_,(uint)(face->enc).firstRow);
                          while ((ushort)local_a0 <= (face->enc).lastRow) {
                            for (FVar52 = local_98->firstCol; FVar52 <= (face->enc).lastCol;
                                FVar52 = FVar52 + 1) {
                              if (((ulong)local_a8 & 4) == 0) {
                                FVar18 = FT_Stream_GetUShortLE(stream);
                              }
                              else {
                                FVar18 = FT_Stream_GetUShort(stream);
                              }
                              FVar19 = FVar18 + 1;
                              if ((FT_UInt16)(FVar18 + 1) == 0) {
                                FVar19 = 0xffff;
                              }
                              *pFVar32 = FVar19;
                              pFVar32 = pFVar32 + 1;
                            }
                            local_a0 = (PCF_Property)CONCAT44(local_a0._4_4_,(int)local_a0 + 1);
                          }
                          FT_Stream_ExitFrame(stream);
                          local_ac = error;
                          if (error != 0) {
                            return 3;
                          }
                          if ((FVar8 != FVar48) &&
                             (local_ac = pcf_get_accel(stream,face,0x100), local_ac != 0)) {
                            return 3;
                          }
                          uVar31 = (face->root).face_flags;
                          (face->root).face_flags = uVar31 | 0x12;
                          if ((face->accel).constantWidth != '\0') {
                            (face->root).face_flags = uVar31 | 0x16;
                          }
                          error = 0;
                          pFVar7 = (face->root).memory;
                          local_68 = (char *)0x0;
                          pcStack_60 = (char *)0x0;
                          format = 0;
                          pcStack_70 = (char *)0x0;
                          (face->root).style_flags = 0;
                          pPVar33 = pcf_find_property(face,"SLANT");
                          if ((((pPVar33 != (PCF_Property)0x0) && (pPVar33->isString != '\0')) &&
                              (uVar25 = (byte)*(pPVar33->value).atom - 0x49, uVar25 < 0x27)) &&
                             ((0x4100000041U >> ((ulong)uVar25 & 0x3f) & 1) != 0)) {
                            (face->root).style_flags = 1;
                            local_68 = "Italic";
                            if ((*(pPVar33->value).atom & 0xdfU) == 0x4f) {
                              local_68 = "Oblique";
                            }
                            local_88 = 3;
                          }
                          pPVar33 = pcf_find_property(face,"WEIGHT_NAME");
                          if (((pPVar33 != (PCF_Property)0x0) && (pPVar33->isString != '\0')) &&
                             ((byte)(*(pPVar33->value).atom | 0x20U) == 0x62)) {
                            (face->root).style_flags = local_88;
                            pcStack_70 = "Bold";
                          }
                          pPVar33 = pcf_find_property(face,"SETWIDTH_NAME");
                          if ((pPVar33 != (PCF_Property)0x0) && (pPVar33->isString != '\0')) {
                            cVar2 = *(pPVar33->value).atom;
                            if ((cVar2 != '\0') && ((cVar2 != 'N' && (cVar2 != 'n')))) {
                              pcStack_60 = (pPVar33->value).atom;
                            }
                          }
                          pPVar33 = pcf_find_property(face,"ADD_STYLE_NAME");
                          if ((pPVar33 != (PCF_Property)0x0) && (pPVar33->isString != '\0')) {
                            cVar2 = *(pPVar33->value).atom;
                            if ((cVar2 != '\0') && ((cVar2 != 'N' && (cVar2 != 'n')))) {
                              format = (FT_ULong)(pPVar33->value).atom;
                            }
                          }
                          FVar51 = 0;
                          for (lVar50 = 0; lVar50 != 4; lVar50 = lVar50 + 1) {
                            (&size)[lVar50] = 0;
                            if ((char *)(&format)[lVar50] != (char *)0x0) {
                              sVar34 = strlen((char *)(&format)[lVar50]);
                              (&size)[lVar50] = sVar34;
                              FVar51 = FVar51 + sVar34 + 1;
                            }
                          }
                          if (FVar51 == 0) {
                            format = (FT_ULong)anon_var_dwarf_20f483;
                            size = 7;
                            FVar51 = 8;
                          }
                          pFVar35 = (FT_String *)ft_mem_qalloc(pFVar7,FVar51,&error);
                          (face->root).style_name = pFVar35;
                          if (error != 0) {
                            return 3;
                          }
                          for (lVar50 = 0; lVar50 != 4; lVar50 = lVar50 + 1) {
                            __src = (void *)(&format)[lVar50];
                            if (__src != (void *)0x0) {
                              sVar34 = (&size)[lVar50];
                              if (pFVar35 != (face->root).style_name) {
                                *pFVar35 = ' ';
                                pFVar35 = pFVar35 + 1;
                              }
                              memcpy(pFVar35,__src,sVar34);
                              if ((lVar50 == 3) || (lVar50 == 0)) {
                                for (sVar36 = 0; sVar34 != sVar36; sVar36 = sVar36 + 1) {
                                  if (pFVar35[sVar36] == ' ') {
                                    pFVar35[sVar36] = '-';
                                  }
                                }
                              }
                              pFVar35 = pFVar35 + sVar34;
                            }
                          }
                          *pFVar35 = '\0';
                          local_ac = error;
                          if (error != 0) {
                            return 3;
                          }
                          pPVar33 = pcf_find_property(face,"FAMILY_NAME");
                          if ((pPVar33 == (PCF_Property)0x0) || (pPVar33->isString == '\0')) {
                            (face->root).family_name = (FT_String *)0x0;
                          }
                          else {
                            pFVar35 = (FT_String *)
                                      ft_mem_strdup(local_80,(pPVar33->value).atom,&local_ac);
                            (face->root).family_name = pFVar35;
                            if (local_ac != 0) {
                              return 3;
                            }
                          }
                          (face->root).num_glyphs = face->nmetrics;
                          (face->root).num_fixed_sizes = 1;
                          pFVar37 = (FT_Bitmap_Size *)ft_mem_alloc(local_80,0x20,&local_ac);
                          (face->root).available_sizes = pFVar37;
                          if (local_ac != 0) {
                            return 3;
                          }
                          uVar38 = (face->accel).fontDescent + (face->accel).fontAscent;
                          uVar31 = -uVar38;
                          if (0 < (long)uVar38) {
                            uVar31 = uVar38;
                          }
                          sVar21 = 0x7fff;
                          if (uVar31 < 0x8000) {
                            sVar20 = (short)uVar38;
                            sVar21 = -sVar20;
                            if (0 < sVar20) {
                              sVar21 = sVar20;
                            }
                          }
                          pFVar37->height = sVar21;
                          pPVar33 = pcf_find_property(face,"AVERAGE_WIDTH");
                          if (pPVar33 == (PCF_Property)0x0) {
                            sVar21 = (short)((sVar21 * 2 + 1) / 3);
                          }
                          else {
                            FVar8 = (pPVar33->value).ul;
                            uVar31 = -FVar8;
                            if (0 < (long)FVar8) {
                              uVar31 = FVar8;
                            }
                            sVar21 = 0x7fff;
                            if (uVar31 < 0x4fff2) {
                              sVar20 = (short)((long)(FVar8 + 5) / 10);
                              sVar21 = -sVar20;
                              if (0 < sVar20) {
                                sVar21 = sVar20;
                              }
                            }
                          }
                          pFVar37->width = sVar21;
                          pPVar33 = pcf_find_property(face,"POINT_SIZE");
                          if (pPVar33 != (PCF_Property)0x0) {
                            uVar31 = (pPVar33->value).l;
                            uVar38 = -uVar31;
                            if (0 < (long)uVar31) {
                              uVar38 = uVar31;
                            }
                            FVar51 = 0x7fff;
                            if (uVar38 < 0x504c3) {
                              FVar51 = FT_MulDiv(uVar38,0x70800,0x11a4e);
                            }
                            pFVar37->size = FVar51;
                          }
                          pPVar33 = pcf_find_property(face,"PIXEL_SIZE");
                          if (pPVar33 != (PCF_Property)0x0) {
                            FVar8 = (pPVar33->value).ul;
                            uVar31 = -FVar8;
                            if (0 < (long)FVar8) {
                              uVar31 = FVar8;
                            }
                            uVar38 = 0x1fffc0;
                            if (uVar31 < 0x8000) {
                              iVar41 = (int)(short)FVar8;
                              iVar27 = -iVar41;
                              if (0 < iVar41) {
                                iVar27 = iVar41;
                              }
                              uVar38 = (ulong)(uint)(iVar27 << 6);
                            }
                            pFVar37->y_ppem = uVar38;
                          }
                          pPVar33 = pcf_find_property(face,"RESOLUTION_X");
                          if (pPVar33 == (PCF_Property)0x0) {
                            sVar21 = 0;
                          }
                          else {
                            uVar31 = (pPVar33->value).l;
                            uVar38 = -uVar31;
                            if (0 < (long)uVar31) {
                              uVar38 = uVar31;
                            }
                            sVar21 = 0x7fff;
                            if (uVar38 < 0x8000) {
                              sVar20 = (short)uVar31;
                              sVar21 = -sVar20;
                              if (0 < sVar20) {
                                sVar21 = sVar20;
                              }
                            }
                          }
                          pPVar33 = pcf_find_property(face,"RESOLUTION_Y");
                          if (pPVar33 == (PCF_Property)0x0) {
                            sVar20 = 0;
                          }
                          else {
                            uVar31 = (pPVar33->value).l;
                            uVar38 = -uVar31;
                            if (0 < (long)uVar31) {
                              uVar38 = uVar31;
                            }
                            sVar20 = 0x7fff;
                            if (uVar38 < 0x8000) {
                              sVar22 = (short)uVar31;
                              sVar20 = -sVar22;
                              if (0 < sVar22) {
                                sVar20 = sVar22;
                              }
                            }
                          }
                          FVar51 = pFVar37->y_ppem;
                          if (FVar51 == 0) {
                            FVar51 = pFVar37->size;
                            pFVar37->y_ppem = FVar51;
                            if (sVar20 == 0) goto LAB_001edc33;
                            FVar51 = FT_MulDiv(FVar51,(long)sVar20,0x48);
                            pFVar37->y_ppem = FVar51;
                          }
                          if ((sVar21 != 0) && (sVar20 != 0)) {
                            FVar51 = FT_MulDiv(FVar51,(long)sVar21,(long)sVar20);
                          }
LAB_001edc33:
                          pFVar37->x_ppem = FVar51;
                          pPVar33 = pcf_find_property(face,"CHARSET_REGISTRY");
                          pPVar39 = pcf_find_property(face,"CHARSET_ENCODING");
                          if (((pPVar33 != (PCF_Property)0x0) &&
                              (pPVar39 != (PCF_Property)0x0 && pPVar33->isString != '\0')) &&
                             (pPVar39->isString != '\0')) {
                            pcVar40 = (char *)ft_mem_strdup(local_80,(pPVar39->value).atom,&local_ac
                                                           );
                            face->charset_encoding = pcVar40;
                            if (local_ac != 0) {
                              return 3;
                            }
                            pcVar40 = (char *)ft_mem_strdup(local_80,(pPVar33->value).atom,&local_ac
                                                           );
                            face->charset_registry = pcVar40;
                          }
                          if (local_ac != 0) {
                            return 3;
                          }
                          return 0;
                        }
                        if (((ulong)local_a8 & 4) == 0) {
                          FT_Stream_ReadULongLE(stream,&error);
                        }
                        else {
                          FT_Stream_ReadULong(stream,&error);
                        }
                      } while (error == 0);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pcf_load_font( FT_Stream  stream,
                 PCF_Face   face,
                 FT_Long    face_index )
  {
    FT_Face    root   = FT_FACE( face );
    FT_Error   error;
    FT_Memory  memory = FT_FACE( face )->memory;
    FT_Bool    hasBDFAccelerators;


    error = pcf_read_TOC( stream, face );
    if ( error )
      goto Exit;

    root->num_faces  = 1;
    root->face_index = 0;

    /* If we are performing a simple font format check, exit immediately. */
    if ( face_index < 0 )
      return FT_Err_Ok;

    error = pcf_get_properties( stream, face );
    if ( error )
      goto Exit;

    /* Use the old accelerators if no BDF accelerators are in the file. */
    hasBDFAccelerators = pcf_has_table_type( face->toc.tables,
                                             face->toc.count,
                                             PCF_BDF_ACCELERATORS );
    if ( !hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* metrics */
    error = pcf_get_metrics( stream, face );
    if ( error )
      goto Exit;

    /* bitmaps */
    error = pcf_get_bitmaps( stream, face );
    if ( error )
      goto Exit;

    /* encodings */
    error = pcf_get_encodings( stream, face );
    if ( error )
      goto Exit;

    /* BDF style accelerators (i.e. bounds based on encoded glyphs) */
    if ( hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_BDF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* XXX: TO DO: inkmetrics and glyph_names are missing */

    /* now construct the face object */
    {
      PCF_Property  prop;


      root->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                          FT_FACE_FLAG_HORIZONTAL;

      if ( face->accel.constantWidth )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( FT_SET_ERROR( pcf_interpret_style( face ) ) )
        goto Exit;

      prop = pcf_find_property( face, "FAMILY_NAME" );
      if ( prop && prop->isString )
      {

#ifdef PCF_CONFIG_OPTION_LONG_FAMILY_NAMES

        PCF_Driver  driver = (PCF_Driver)FT_FACE_DRIVER( face );


        if ( !driver->no_long_family_names )
        {
          /* Prepend the foundry name plus a space to the family name.     */
          /* There are many fonts just called `Fixed' which look           */
          /* completely different, and which have nothing to do with each  */
          /* other.  When selecting `Fixed' in KDE or Gnome one gets       */
          /* results that appear rather random, the style changes often if */
          /* one changes the size and one cannot select some fonts at all. */
          /*                                                               */
          /* We also check whether we have `wide' characters; all put      */
          /* together, we get family names like `Sony Fixed' or `Misc      */
          /* Fixed Wide'.                                                  */

          PCF_Property  foundry_prop, point_size_prop, average_width_prop;

          int  l    = ft_strlen( prop->value.atom ) + 1;
          int  wide = 0;


          foundry_prop       = pcf_find_property( face, "FOUNDRY" );
          point_size_prop    = pcf_find_property( face, "POINT_SIZE" );
          average_width_prop = pcf_find_property( face, "AVERAGE_WIDTH" );

          if ( point_size_prop && average_width_prop )
          {
            if ( average_width_prop->value.l >= point_size_prop->value.l )
            {
              /* This font is at least square shaped or even wider */
              wide = 1;
              l   += ft_strlen( " Wide" );
            }
          }

          if ( foundry_prop && foundry_prop->isString )
          {
            l += ft_strlen( foundry_prop->value.atom ) + 1;

            if ( FT_QALLOC( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, foundry_prop->value.atom );
            ft_strcat( root->family_name, " " );
            ft_strcat( root->family_name, prop->value.atom );
          }
          else
          {
            if ( FT_QALLOC( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, prop->value.atom );
          }

          if ( wide )
            ft_strcat( root->family_name, " Wide" );
        }
        else

#endif /* PCF_CONFIG_OPTION_LONG_FAMILY_NAMES */

        {
          if ( FT_STRDUP( root->family_name, prop->value.atom ) )
            goto Exit;
        }
      }
      else
        root->family_name = NULL;

      root->num_glyphs = (FT_Long)face->nmetrics;

      root->num_fixed_sizes = 1;
      if ( FT_NEW( root->available_sizes ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = root->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;


        /* for simplicity, we take absolute values of integer properties */

#if 0
        bsize->height = face->accel.maxbounds.ascent << 6;
#endif

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( face->accel.fontAscent + face->accel.fontDescent < 0 )
          FT_TRACE0(( "pcf_load_font: negative height\n" ));
#endif
        if ( FT_ABS( face->accel.fontAscent +
                     face->accel.fontDescent ) > 0x7FFF )
        {
          bsize->height = 0x7FFF;
          FT_TRACE0(( "pcf_load_font: clamping height to value %d\n",
                      bsize->height ));
        }
        else
          bsize->height = FT_ABS( (FT_Short)( face->accel.fontAscent +
                                              face->accel.fontDescent ) );

        prop = pcf_find_property( face, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative average width\n" ));
#endif
          if ( ( FT_ABS( prop->value.l ) > 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = ( bsize->height * 2 + 1 ) / 3;
        }

        prop = pcf_find_property( face, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( FT_ABS( prop->value.l ) > 0x504C2L ) /* 0x7FFF * 72270/7200 */
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping point size to value %ld\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }

        prop = pcf_find_property( face, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative pixel size\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "pcf_load_font: clamping pixel size to value %ld\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = pcf_find_property( face, "RESOLUTION_X" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative X resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)prop->value.l );
        }

        prop = pcf_find_property( face, "RESOLUTION_Y" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative Y resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)prop->value.l );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* set up charset */
      {
        PCF_Property  charset_registry, charset_encoding;


        charset_registry = pcf_find_property( face, "CHARSET_REGISTRY" );
        charset_encoding = pcf_find_property( face, "CHARSET_ENCODING" );

        if ( charset_registry && charset_registry->isString &&
             charset_encoding && charset_encoding->isString )
        {
          if ( FT_STRDUP( face->charset_encoding,
                          charset_encoding->value.atom ) ||
               FT_STRDUP( face->charset_registry,
                          charset_registry->value.atom ) )
            goto Exit;
        }
      }
    }

  Exit:
    if ( error )
    {
      /* This is done to respect the behaviour of the original */
      /* PCF font driver.                                      */
      error = FT_THROW( Invalid_File_Format );
    }

    return error;
  }